

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

iterator __thiscall
ska::detailv3::
sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>
::find(sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>
       *this,basic_string_view<char,_std::char_traits<char>_> *key)

{
  EntryPointer psVar1;
  EntryPointer psVar2;
  size_t __n;
  char *__s1;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  char cVar6;
  EntryPointer psVar7;
  size_type __rlen;
  
  sVar4 = std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                    ((hash<std::basic_string_view<char,_std::char_traits<char>_>_> *)this,key);
  uVar5 = sVar4 * -0x61c8864680b583eb >> ((this->hash_policy).shift & 0x3fU);
  psVar2 = this->entries;
  if (-1 < psVar2[uVar5].distance_from_desired) {
    __n = key->_M_len;
    __s1 = key->_M_str;
    cVar6 = '\0';
    psVar7 = psVar2 + uVar5;
    do {
      if (__n == (psVar7->field_1).value._M_len) {
        if (__n == 0) {
          return (iterator)psVar7;
        }
        iVar3 = bcmp(__s1,(psVar7->field_1).value._M_str,__n);
        if (iVar3 == 0) {
          return (iterator)psVar7;
        }
      }
      cVar6 = cVar6 + '\x01';
      psVar1 = psVar7 + 1;
      psVar7 = psVar7 + 1;
    } while (cVar6 <= psVar1->distance_from_desired);
  }
  return (iterator)(psVar2 + this->num_slots_minus_one + (long)this->max_lookups);
}

Assistant:

iterator find(const FindKey & key)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer it = entries + ptrdiff_t(index);
        for (int8_t distance = 0; it->distance_from_desired >= distance; ++distance, ++it)
        {
            if (compares_equal(key, it->value))
                return { it };
        }
        return end();
    }